

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  value_type *__v;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_01;
  byte bVar1;
  StorageClass SVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ExecutionModel EVar6;
  ExecutionModel EVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  SPIRVariable *pSVar11;
  SPIRType *pSVar12;
  ulong uVar13;
  SPIRType *pSVar14;
  SPIRConstant *pSVar15;
  Meta *pMVar16;
  SPIREntryPoint *pSVar17;
  SPIRExpression *pSVar18;
  mapped_type *pmVar19;
  mapped_type *this_02;
  CompilerError *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint *insert_begin;
  ulong uVar20;
  ID IVar21;
  uint *itr;
  string *this_04;
  uint32_t i;
  ulong uVar22;
  uint32_t i_1;
  uint uVar23;
  TypeID *pTVar24;
  uint32_t index;
  uint32_t local_124;
  uint local_120;
  uint32_t const_mbr_id;
  AccessChainMeta meta;
  string e;
  string local_c8;
  SmallVector<unsigned_int,_8UL> indices;
  string local_70;
  string local_50;
  
  pSVar11 = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  EVar6 = Compiler::get_execution_model((Compiler *)this);
  bVar5 = (this->msl_options).multi_patch_workgroup;
  IVar21.id = ops[2];
  if (pSVar11 == (SPIRVariable *)0x0) {
    local_120 = 0;
    bVar3 = true;
    bVar4 = false;
  }
  else {
    bVar3 = Compiler::has_decoration((Compiler *)this,IVar21,DecorationPatch);
    bVar4 = true;
    if (!bVar3) {
      pSVar12 = Compiler::get_variable_data_type((Compiler *)this,pSVar11);
      bVar4 = is_patch_block(this,pSVar12);
    }
    SVar2 = pSVar11->storage;
    uVar13 = (ulong)SVar2;
    if (SVar2 == StorageClassInput) {
      bVar3 = false;
    }
    else if (SVar2 == StorageClassOutput) {
      EVar7 = Compiler::get_execution_model((Compiler *)this);
      uVar13 = (ulong)EVar7;
      bVar3 = EVar7 != ExecutionModelTessellationControl;
    }
    else {
      bVar3 = true;
    }
    IVar21.id = ops[2];
    local_120 = (uint)CONCAT71((int7)(uVar13 >> 8),(pSVar11->super_IVariant).self.id != IVar21.id);
  }
  uVar8 = Compiler::get_decoration((Compiler *)this,IVar21,DecorationBuiltIn);
  if (((bVar3) || (pSVar11 == (SPIRVariable *)0x0)) || (bVar4 != false)) {
    if (pSVar11 == (SPIRVariable *)0x0) {
      IVar21.id = 0;
      goto LAB_0029a2c1;
    }
LAB_0029a10b:
    IVar21.id = (pSVar11->super_IVariant).self.id;
LAB_0029a2c1:
    pMVar16 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,IVar21);
    EVar6 = Compiler::get_execution_model((Compiler *)this);
    if (pSVar11 == (SPIRVariable *)0x0) {
      return false;
    }
    if (pMVar16 == (Meta *)0x0) {
      return false;
    }
    if (EVar6 != ExecutionModelTessellationControl) {
      return false;
    }
    if ((((pMVar16->decoration).builtin_type == BuiltInTessLevelInner) &&
        (pSVar17 = Compiler::get_entry_point((Compiler *)this),
        ((pSVar17->flags).lower & 0x400000) != 0)) &&
       ((pSVar15 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,ops[3]),
        pSVar15 == (SPIRConstant *)0x0 || ((pSVar15->m).c[0].r[0].u32 != 1)))) {
      pSVar11 = Compiler::set<spirv_cross::SPIRVariable,spirv_cross::SPIRVariable&>
                          ((Compiler *)this,ops[1],pSVar11);
      *(uint32_t *)&(pSVar11->super_IVariant).field_0xc = *ops;
      this_01 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      indices.super_VectorView<unsigned_int>.ptr =
           (uint *)CONCAT44(indices.super_VectorView<unsigned_int>.ptr._4_4_,ops[2]);
      pmVar19 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_01,(key_type *)&indices);
      e._M_dataplus._M_p._0_4_ = ops[1];
      this_02 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_01,(key_type *)&e);
      Meta::operator=(this_02,pmVar19);
      Compiler::inherit_expression_dependencies((Compiler *)this,ops[1],ops[2]);
      return true;
    }
    return false;
  }
  bVar3 = Compiler::is_builtin_variable((Compiler *)this,pSVar11);
  if ((bVar3) && ((4 < uVar8 || (uVar8 == 2)))) {
    pSVar12 = Compiler::get_variable_data_type((Compiler *)this,pSVar11);
    if (*(int *)&(pSVar12->super_IVariant).field_0xc != 0xf) goto LAB_0029a10b;
  }
  meta.storage_physical_type = 0;
  meta.need_transpose = false;
  meta.storage_is_packed = false;
  meta.storage_is_invariant = false;
  meta.flattened_struct = false;
  indices.super_VectorView<unsigned_int>.ptr = (uint *)&indices.stack_storage;
  indices.super_VectorView<unsigned_int>.buffer_size = 0;
  indices.buffer_capacity = 8;
  uVar9 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  SmallVector<unsigned_int,_8UL>::reserve(&indices,(ulong)(length - 2));
  uVar8 = this->next_metal_resource_ids[(ulong)(pSVar11->storage != StorageClassInput) + 0xc];
  if ((char)local_120 == '\0') {
    SmallVector<unsigned_int,_8UL>::push_back(&indices,ops + 3);
    local_124 = uVar8;
  }
  else {
    local_124 = ops[2];
  }
  pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*ops);
  const_mbr_id = uVar9;
  index = Compiler::get_extended_decoration
                    ((Compiler *)this,(pSVar11->super_IVariant).self.id,
                     SPIRVCrossDecorationInterfaceMemberIndex);
  uVar13 = (ulong)length;
  if (pSVar11->storage == StorageClassInput) {
LAB_0029a185:
    pSVar14 = Compiler::get_variable_element_type((Compiler *)this,pSVar11);
    uVar10 = local_120 & 0xff;
    uVar23 = -uVar10 + 4;
    if ((index == 0xffffffff) && (uVar23 < length)) {
      uVar9 = (pSVar11->super_IVariant).self.id;
      pSVar15 = Compiler::get_constant((Compiler *)this,(ConstantID)ops[uVar23]);
      index = Compiler::get_extended_member_decoration
                        ((Compiler *)this,uVar9,(pSVar15->m).c[0].r[0].u32,
                         SPIRVCrossDecorationInterfaceMemberIndex);
      if (index == 0xffffffff) {
        __assert_fail("index != uint32_t(-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x17b2,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                     );
      }
      pSVar15 = Compiler::get_constant((Compiler *)this,(ConstantID)ops[uVar23]);
      pSVar14 = Compiler::get<spirv_cross::SPIRType>
                          ((Compiler *)this,
                           (pSVar14->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                           [(pSVar15->m).c[0].r[0].u32].id);
      uVar23 = -uVar10 + 5;
    }
    bVar1 = EVar6 == ExecutionModelTessellationControl & bVar5;
    uVar20 = (ulong)uVar23;
    uVar22 = (ulong)length;
    if (length < uVar23) {
      uVar22 = (ulong)uVar23;
    }
    for (; uVar20 < uVar13; uVar20 = uVar20 + 1) {
      if (((bVar1 != 0) ||
          ((bVar5 = Compiler::is_array((Compiler *)this,pSVar14), !bVar5 &&
           (bVar5 = Compiler::is_matrix((Compiler *)this,pSVar14), !bVar5)))) &&
         (*(int *)&(pSVar14->super_IVariant).field_0xc != 0xf)) {
        uVar22 = uVar20 & 0xffffffff;
        break;
      }
      pSVar15 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,ops[uVar20]);
      if ((pSVar15 == (SPIRConstant *)0x0) || (pSVar15->specialization == true)) {
        this_03 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&e,
                   "Trying to dynamically index into an array interface variable in tessellation. This is currently unsupported."
                   ,(allocator *)&local_c8);
        CompilerError::CompilerError(this_03,&e);
        __cxa_throw(this_03,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar10 = (pSVar15->m).c[0].r[0].u32;
      index = index + uVar10;
      uVar9 = (pSVar14->parent_type).id;
      if (uVar9 == 0) {
        if (*(int *)&(pSVar14->super_IVariant).field_0xc == 0xf) {
          uVar9 = (pSVar14->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar10].id;
          goto LAB_0029a2ac;
        }
      }
      else {
LAB_0029a2ac:
        pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
      }
    }
    if (bVar1 == 0) {
      bVar5 = Compiler::is_matrix((Compiler *)this,pSVar12);
      if ((!bVar5) &&
         (bVar5 = Compiler::is_array((Compiler *)this,pSVar12),
         !bVar5 && *(int *)&(pSVar12->super_IVariant).field_0xc != 0xf)) goto LAB_0029a38f;
    }
    else if (*(int *)&(pSVar12->super_IVariant).field_0xc != 0xf) {
LAB_0029a38f:
      uVar9 = const_mbr_id;
      e._M_dataplus._M_p._0_4_ = get_uint_type_id(this);
      local_c8._M_dataplus._M_p._0_1_ = 0;
      Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                ((Compiler *)this,uVar9,(uint *)&e,&index,(bool *)&local_c8);
      SmallVector<unsigned_int,_8UL>::push_back(&indices,&const_mbr_id);
      if (uVar20 < uVar13) {
        itr = indices.super_VectorView<unsigned_int>.ptr +
              indices.super_VectorView<unsigned_int>.buffer_size;
        insert_begin = ops + uVar22;
        goto LAB_0029a460;
      }
      goto LAB_0029a465;
    }
    Compiler::set_extended_decoration
              ((Compiler *)this,ops[1],SPIRVCrossDecorationInterfaceMemberIndex,index);
  }
  else {
    pSVar14 = Compiler::get_variable_element_type((Compiler *)this,pSVar11);
    bVar3 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(pSVar14->super_IVariant).self.id,DecorationBlock);
    uVar9 = const_mbr_id;
    if (bVar3) goto LAB_0029a185;
    if (index == 0xffffffff) {
      __assert_fail("index != uint32_t(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x17e3,
                    "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                   );
    }
    e._M_dataplus._M_p._0_4_ = get_uint_type_id(this);
    local_c8._M_dataplus._M_p._0_1_ = 0;
    Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
              ((Compiler *)this,uVar9,(uint *)&e,&index,(bool *)&local_c8);
    SmallVector<unsigned_int,_8UL>::push_back(&indices,&const_mbr_id);
    itr = indices.super_VectorView<unsigned_int>.ptr +
          indices.super_VectorView<unsigned_int>.buffer_size;
    insert_begin = ops + 4;
LAB_0029a460:
    SmallVector<unsigned_int,_8UL>::insert(&indices,itr,insert_begin,ops + uVar13);
  }
LAB_0029a465:
  e._M_dataplus._M_p = (pointer)&e.field_2;
  e._M_string_length = 0;
  e.field_2._M_local_buf[0] = '\0';
  if ((char)local_120 == '\0') {
    CompilerGLSL::access_chain_abi_cxx11_
              (&local_c8,&this->super_CompilerGLSL,local_124,
               indices.super_VectorView<unsigned_int>.ptr,
               (uint32_t)indices.super_VectorView<unsigned_int>.buffer_size,pSVar12,&meta,true);
  }
  else {
    pSVar18 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,local_124);
    if ((pSVar18 != (SPIRExpression *)0x0) &&
       ((pSVar18->implied_read_expressions).
        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 2)) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_124,true);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             indices.super_VectorView<unsigned_int>.ptr;
      CompilerGLSL::access_chain_internal_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,uVar8,
                 indices.super_VectorView<unsigned_int>.ptr,
                 (uint32_t)indices.super_VectorView<unsigned_int>.buffer_size,2,&meta);
      join<std::__cxx11::string,std::__cxx11::string>
                (&local_c8,(spirv_cross *)&local_50,&local_70,ts_1);
      ::std::__cxx11::string::operator=((string *)&e,(string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_70);
      this_04 = &local_50;
      goto LAB_0029a5ce;
    }
    CompilerGLSL::access_chain_internal_abi_cxx11_
              (&local_c8,&this->super_CompilerGLSL,local_124,
               indices.super_VectorView<unsigned_int>.ptr,
               (uint32_t)indices.super_VectorView<unsigned_int>.buffer_size,0,&meta);
  }
  this_04 = &local_c8;
  ::std::__cxx11::string::operator=((string *)&e,(string *)this_04);
LAB_0029a5ce:
  ::std::__cxx11::string::~string((string *)this_04);
  pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar11);
  bVar5 = Compiler::has_extended_decoration
                    ((Compiler *)this,ops[2],SPIRVCrossDecorationTessIOOriginalInputTypeID);
  if (bVar5) {
    uVar8 = Compiler::get_extended_decoration
                      ((Compiler *)this,ops[2],SPIRVCrossDecorationTessIOOriginalInputTypeID);
    pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar8);
  }
  for (uVar22 = 3; uVar22 < uVar13; uVar22 = uVar22 + 1) {
    bVar5 = Compiler::is_array((Compiler *)this,pSVar14);
    if ((bVar5) || (*(int *)&(pSVar14->super_IVariant).field_0xc != 0xf)) {
      pTVar24 = &pSVar14->parent_type;
    }
    else {
      pSVar15 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,ops[uVar22]);
      pTVar24 = (pSVar14->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr +
                (pSVar15->m).c[0].r[0].u32;
    }
    pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,pTVar24->id);
  }
  bVar5 = Compiler::is_array((Compiler *)this,pSVar14);
  if ((((!bVar5) && (bVar5 = Compiler::is_matrix((Compiler *)this,pSVar14), !bVar5)) &&
      (*(int *)&(pSVar14->super_IVariant).field_0xc != 0xf)) &&
     (pSVar12->vecsize < pSVar14->vecsize)) {
    CompilerGLSL::vector_swizzle(pSVar12->vecsize,0);
    ::std::__cxx11::string::append((char *)&e);
  }
  uVar8 = ops[1];
  local_c8._M_dataplus._M_p._0_1_ = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[2]);
  pSVar18 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int_const&,bool>
                      ((Compiler *)this,uVar8,&e,ops,(bool *)&local_c8);
  __v = ops + 1;
  (pSVar18->loaded_from).id = (pSVar11->super_IVariant).self.id;
  pSVar18->need_transpose = meta.need_transpose;
  pSVar18->access_chain = true;
  if (meta.storage_is_packed == true) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*__v,SPIRVCrossDecorationPhysicalTypePacked,0);
  }
  if (meta.storage_physical_type != 0) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*__v,SPIRVCrossDecorationPhysicalTypeID,meta.storage_physical_type);
  }
  if (meta.storage_is_invariant == true) {
    Compiler::set_decoration((Compiler *)this,(ID)*__v,DecorationInvariant,0);
  }
  Compiler::set_extended_decoration
            ((Compiler *)this,*__v,SPIRVCrossDecorationTessIOOriginalInputTypeID,
             (pSVar14->super_IVariant).self.id);
  this_00 = &(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries;
  ::std::__detail::
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)this_00,__v);
  ::std::__detail::
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking,__v);
  for (uVar22 = 2; uVar22 < uVar13; uVar22 = uVar22 + 1) {
    Compiler::inherit_expression_dependencies((Compiler *)this,ops[1],ops[uVar22]);
    Compiler::add_implied_read_expression((Compiler *)this,pSVar18,ops[uVar22]);
  }
  if ((pSVar18->expression_dependencies).
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 0) {
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&this_00->_M_h,__v);
  }
  ::std::__cxx11::string::~string((string *)&e);
  SmallVector<unsigned_int,_8UL>::~SmallVector(&indices);
  return true;
}

Assistant:

bool CompilerMSL::emit_tessellation_access_chain(const uint32_t *ops, uint32_t length)
{
	// If this is a per-vertex output, remap it to the I/O array buffer.

	// Any object which did not go through IO flattening shenanigans will go there instead.
	// We will unflatten on-demand instead as needed, but not all possible cases can be supported, especially with arrays.

	auto *var = maybe_get_backing_variable(ops[2]);
	bool patch = false;
	bool flat_data = false;
	bool ptr_is_chain = false;
	bool multi_patch = get_execution_model() == ExecutionModelTessellationControl && msl_options.multi_patch_workgroup;

	if (var)
	{
		patch = has_decoration(ops[2], DecorationPatch) || is_patch_block(get_variable_data_type(*var));

		// Should match strip_array in add_interface_block.
		flat_data = var->storage == StorageClassInput ||
		            (var->storage == StorageClassOutput && get_execution_model() == ExecutionModelTessellationControl);

		// We might have a chained access chain, where
		// we first take the access chain to the control point, and then we chain into a member or something similar.
		// In this case, we need to skip gl_in/gl_out remapping.
		ptr_is_chain = var->self != ID(ops[2]);
	}

	BuiltIn bi_type = BuiltIn(get_decoration(ops[2], DecorationBuiltIn));
	if (var && flat_data && !patch &&
	    (!is_builtin_variable(*var) || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
	     bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
	     get_variable_data_type(*var).basetype == SPIRType::Struct))
	{
		AccessChainMeta meta;
		SmallVector<uint32_t> indices;
		uint32_t next_id = ir.increase_bound_by(1);

		indices.reserve(length - 3 + 1);

		uint32_t first_non_array_index = ptr_is_chain ? 3 : 4;
		VariableID stage_var_id = var->storage == StorageClassInput ? stage_in_ptr_var_id : stage_out_ptr_var_id;
		VariableID ptr = ptr_is_chain ? VariableID(ops[2]) : stage_var_id;
		if (!ptr_is_chain)
		{
			// Index into gl_in/gl_out with first array index.
			indices.push_back(ops[3]);
		}

		auto &result_ptr_type = get<SPIRType>(ops[0]);

		uint32_t const_mbr_id = next_id++;
		uint32_t index = get_extended_decoration(var->self, SPIRVCrossDecorationInterfaceMemberIndex);
		if (var->storage == StorageClassInput || has_decoration(get_variable_element_type(*var).self, DecorationBlock))
		{
			uint32_t i = first_non_array_index;
			auto *type = &get_variable_element_type(*var);
			if (index == uint32_t(-1) && length >= (first_non_array_index + 1))
			{
				// Maybe this is a struct type in the input class, in which case
				// we put it as a decoration on the corresponding member.
				index = get_extended_member_decoration(var->self, get_constant(ops[first_non_array_index]).scalar(),
				                                       SPIRVCrossDecorationInterfaceMemberIndex);
				assert(index != uint32_t(-1));
				i++;
				type = &get<SPIRType>(type->member_types[get_constant(ops[first_non_array_index]).scalar()]);
			}

			// In this case, we're poking into flattened structures and arrays, so now we have to
			// combine the following indices. If we encounter a non-constant index,
			// we're hosed.
			for (; i < length; ++i)
			{
				if ((multi_patch || (!is_array(*type) && !is_matrix(*type))) && type->basetype != SPIRType::Struct)
					break;

				auto *c = maybe_get<SPIRConstant>(ops[i]);
				if (!c || c->specialization)
					SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable in tessellation. "
					                  "This is currently unsupported.");

				// We're in flattened space, so just increment the member index into IO block.
				// We can only do this once in the current implementation, so either:
				// Struct, Matrix or 1-dimensional array for a control point.
				index += c->scalar();

				if (type->parent_type)
					type = &get<SPIRType>(type->parent_type);
				else if (type->basetype == SPIRType::Struct)
					type = &get<SPIRType>(type->member_types[c->scalar()]);
			}

			if ((!multi_patch && (is_matrix(result_ptr_type) || is_array(result_ptr_type))) ||
			    result_ptr_type.basetype == SPIRType::Struct)
			{
				// We're not going to emit the actual member name, we let any further OpLoad take care of that.
				// Tag the access chain with the member index we're referencing.
				set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, index);
			}
			else
			{
				// Access the appropriate member of gl_in/gl_out.
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);

				// Append any straggling access chain indices.
				if (i < length)
					indices.insert(indices.end(), ops + i, ops + length);
			}
		}
		else
		{
			assert(index != uint32_t(-1));
			set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
			indices.push_back(const_mbr_id);

			indices.insert(indices.end(), ops + 4, ops + length);
		}

		// We use the pointer to the base of the input/output array here,
		// so this is always a pointer chain.
		string e;

		if (!ptr_is_chain)
		{
			// This is the start of an access chain, use ptr_chain to index into control point array.
			e = access_chain(ptr, indices.data(), uint32_t(indices.size()), result_ptr_type, &meta, true);
		}
		else
		{
			// If we're accessing a struct, we need to use member indices which are based on the IO block,
			// not actual struct type, so we have to use a split access chain here where
			// first path resolves the control point index, i.e. gl_in[index], and second half deals with
			// looking up flattened member name.

			// However, it is possible that we partially accessed a struct,
			// by taking pointer to member inside the control-point array.
			// For this case, we fall back to a natural access chain since we have already dealt with remapping struct members.
			// One way to check this here is if we have 2 implied read expressions.
			// First one is the gl_in/gl_out struct itself, then an index into that array.
			// If we have traversed further, we use a normal access chain formulation.
			auto *ptr_expr = maybe_get<SPIRExpression>(ptr);
			if (ptr_expr && ptr_expr->implied_read_expressions.size() == 2)
			{
				e = join(to_expression(ptr),
				         access_chain_internal(stage_var_id, indices.data(), uint32_t(indices.size()),
				                               ACCESS_CHAIN_CHAIN_ONLY_BIT, &meta));
			}
			else
			{
				e = access_chain_internal(ptr, indices.data(), uint32_t(indices.size()), 0, &meta);
			}
		}

		// Get the actual type of the object that was accessed. If it's a vector type and we changed it,
		// then we'll need to add a swizzle.
		// For this, we can't necessarily rely on the type of the base expression, because it might be
		// another access chain, and it will therefore already have the "correct" type.
		auto *expr_type = &get_variable_data_type(*var);
		if (has_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID))
			expr_type = &get<SPIRType>(get_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID));
		for (uint32_t i = 3; i < length; i++)
		{
			if (!is_array(*expr_type) && expr_type->basetype == SPIRType::Struct)
				expr_type = &get<SPIRType>(expr_type->member_types[get<SPIRConstant>(ops[i]).scalar()]);
			else
				expr_type = &get<SPIRType>(expr_type->parent_type);
		}
		if (!is_array(*expr_type) && !is_matrix(*expr_type) && expr_type->basetype != SPIRType::Struct &&
		    expr_type->vecsize > result_ptr_type.vecsize)
			e += vector_swizzle(result_ptr_type.vecsize, 0);

		auto &expr = set<SPIRExpression>(ops[1], move(e), ops[0], should_forward(ops[2]));
		expr.loaded_from = var->self;
		expr.need_transpose = meta.need_transpose;
		expr.access_chain = true;

		// Mark the result as being packed if necessary.
		if (meta.storage_is_packed)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypePacked);
		if (meta.storage_physical_type != 0)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypeID, meta.storage_physical_type);
		if (meta.storage_is_invariant)
			set_decoration(ops[1], DecorationInvariant);
		// Save the type we found in case the result is used in another access chain.
		set_extended_decoration(ops[1], SPIRVCrossDecorationTessIOOriginalInputTypeID, expr_type->self);

		// If we have some expression dependencies in our access chain, this access chain is technically a forwarded
		// temporary which could be subject to invalidation.
		// Need to assume we're forwarded while calling inherit_expression_depdendencies.
		forwarded_temporaries.insert(ops[1]);
		// The access chain itself is never forced to a temporary, but its dependencies might.
		suppressed_usage_tracking.insert(ops[1]);

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(expr, ops[i]);
		}

		// If we have no dependencies after all, i.e., all indices in the access chain are immutable temporaries,
		// we're not forwarded after all.
		if (expr.expression_dependencies.empty())
			forwarded_temporaries.erase(ops[1]);

		return true;
	}

	// If this is the inner tessellation level, and we're tessellating triangles,
	// drop the last index. It isn't an array in this case, so we can't have an
	// array reference here. We need to make this ID a variable instead of an
	// expression so we don't try to dereference it as a variable pointer.
	// Don't do this if the index is a constant 1, though. We need to drop stores
	// to that one.
	auto *m = ir.find_meta(var ? var->self : ID(0));
	if (get_execution_model() == ExecutionModelTessellationControl && var && m &&
	    m->decoration.builtin_type == BuiltInTessLevelInner && get_entry_point().flags.get(ExecutionModeTriangles))
	{
		auto *c = maybe_get<SPIRConstant>(ops[3]);
		if (c && c->scalar() == 1)
			return false;
		auto &dest_var = set<SPIRVariable>(ops[1], *var);
		dest_var.basetype = ops[0];
		ir.meta[ops[1]] = ir.meta[ops[2]];
		inherit_expression_dependencies(ops[1], ops[2]);
		return true;
	}

	return false;
}